

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

void __thiscall
cnn::Node::forward(Node *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
                  Tensor *fx)

{
  Tensor *pTVar1;
  int iVar2;
  uint uVar3;
  pointer ppTVar4;
  pointer ppTVar5;
  size_t i_1;
  uint b;
  size_t i;
  ulong uVar6;
  long lVar7;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> xs_elems;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs_ptrs;
  Tensor fx_elem;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_b8;
  Tensor *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  Tensor local_78;
  
  iVar2 = (*this->_vptr_Node[7])();
  if (((char)iVar2 == '\0') && (uVar3 = (fx->d).bd, uVar3 != 1)) {
    local_a0 = fx;
    for (b = 0; b < uVar3; b = b + 1) {
      local_b8.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88 = 0;
      uVar6 = 0;
      local_b8.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98 = 0;
      uStack_90 = 0;
      while( true ) {
        ppTVar5 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)ppTVar5 - (long)ppTVar4 >> 3) <= uVar6) break;
        Tensor::batch_elem(&local_78,ppTVar4[uVar6],b);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::emplace_back<cnn::Tensor>
                  (&local_b8,&local_78);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_78.bs);
        uVar6 = uVar6 + 1;
      }
      lVar7 = 0;
      for (uVar6 = 0; pTVar1 = local_a0, uVar6 < (ulong)((long)ppTVar5 - (long)ppTVar4 >> 3);
          uVar6 = uVar6 + 1) {
        local_78.d.d._0_8_ =
             (long)((local_b8.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                     super__Vector_impl_data._M_start)->d).d + lVar7;
        std::vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>>::
        emplace_back<cnn::Tensor_const*>
                  ((vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>> *)&local_98,
                   (Tensor **)&local_78);
        ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppTVar5 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        lVar7 = lVar7 + 0x48;
      }
      Tensor::batch_elem(&local_78,local_a0,b);
      (*this->_vptr_Node[5])
                (this,(vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>> *)&local_98,
                 &local_78);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_78.bs);
      std::_Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::~_Vector_base
                ((_Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                 &local_98);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_b8);
      uVar3 = (pTVar1->d).bd;
    }
    return;
  }
  (*this->_vptr_Node[5])(this,xs,fx);
  return;
}

Assistant:

void Node::forward(const std::vector<const Tensor*>& xs,
                   Tensor& fx) const {
  if(this->supports_multibatch() || fx.d.batch_elems() == 1) {
    forward_impl(xs, fx);
  } else {
    for(unsigned b = 0; b < fx.d.batch_elems(); ++b) {
      std::vector<Tensor>  xs_elems;
      std::vector<const Tensor*> xs_ptrs;
      for(size_t i = 0; i < xs.size(); ++i) xs_elems.push_back(xs[i]->batch_elem(b));
      for(size_t i = 0; i < xs.size(); ++i) xs_ptrs.push_back(&xs_elems[i]);
      Tensor fx_elem(fx.batch_elem(b));
      forward_impl(xs_ptrs, fx_elem);
    }
  }
}